

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint index;
  uint32_t non_shared;
  uint32_t shared;
  Slice mid_key;
  uint32_t value_length;
  uint local_50;
  uint32_t local_4c;
  char *local_48;
  ulong local_40;
  uint32_t local_34;
  
  uVar1 = this->num_restarts_ - 1;
  index = 0;
  while( true ) {
    uVar5 = uVar1;
    if (uVar5 <= index) {
      SeekToRestartPoint(this,index);
      do {
        bVar2 = ParseNextKey(this);
        if (!bVar2) {
          return;
        }
        local_48 = (this->key_)._M_dataplus._M_p;
        local_40 = (this->key_)._M_string_length;
        iVar3 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_48,target);
      } while (iVar3 < 0);
      return;
    }
    uVar6 = uVar5 + index + 1 >> 1;
    pcVar4 = this->data_ + this->restarts_;
    pcVar4 = DecodeEntry(this->data_ + *(uint *)(pcVar4 + (ulong)uVar6 * 4),pcVar4,&local_4c,
                         &local_50,&local_34);
    if ((pcVar4 == (char *)0x0) || (local_4c != 0)) break;
    local_40 = (ulong)local_50;
    local_48 = pcVar4;
    iVar3 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_48,target);
    uVar1 = uVar6 - 1;
    if (iVar3 < 0) {
      uVar1 = uVar5;
      index = uVar6;
    }
  }
  CorruptionError(this);
  return;
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }